

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

void expose_parent_dirs(zip *zip,char *name,size_t name_length)

{
  char *pcVar1;
  archive_rb_node *self;
  archive_rb_tree *in_RDX;
  char *s;
  zip_entry *dir;
  archive_string str;
  archive_rb_tree *rbt;
  archive_rb_tree *rbt_00;
  archive_rb_node *self_00;
  
  rbt = (archive_rb_tree *)0x0;
  self_00 = (archive_rb_node *)0x0;
  rbt_00 = (archive_rb_tree *)0x0;
  archive_strncat((archive_string *)0x0,(void *)0x0,0);
  while (pcVar1 = strrchr((char *)rbt,0x2f), pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
    self = __archive_rb_tree_find_node(rbt_00,rbt);
    if (self == (archive_rb_node *)0x0) break;
    __archive_rb_tree_remove_node(rbt,self);
    archive_string_free((archive_string *)0x16ba24);
    __archive_rb_tree_insert_node(in_RDX,self_00);
  }
  archive_string_free((archive_string *)0x16ba43);
  return;
}

Assistant:

static void
expose_parent_dirs(struct zip *zip, const char *name, size_t name_length)
{
	struct archive_string str;
	struct zip_entry *dir;
	char *s;

	archive_string_init(&str);
	archive_strncpy(&str, name, name_length);
	for (;;) {
		s = strrchr(str.s, '/');
		if (s == NULL)
			break;
		*s = '\0';
		/* Transfer the parent directory from zip->tree_rsrc RB
		 * tree to zip->tree RB tree to expose. */
		dir = (struct zip_entry *)
		    __archive_rb_tree_find_node(&zip->tree_rsrc, str.s);
		if (dir == NULL)
			break;
		__archive_rb_tree_remove_node(&zip->tree_rsrc, &dir->node);
		archive_string_free(&dir->rsrcname);
		__archive_rb_tree_insert_node(&zip->tree, &dir->node);
	}
	archive_string_free(&str);
}